

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O0

pint p_test_case_psocket_nomem_test(void)

{
  int iVar1;
  undefined4 uVar2;
  pint pVar3;
  long lVar4;
  long lVar5;
  code *local_30;
  PMemVTable vtable;
  PSocketAddress *sock_addr;
  PSocket *socket;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar4 = p_socket_new(2,2,0x11,0);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x252);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  vtable.f_free = (_func_void_ppointer *)p_socket_address_new("127.0.0.1",0x7dd3);
  if (vtable.f_free == (_func_void_ppointer *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x256);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_bind(lVar4,vtable.f_free,1,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,599);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(vtable.f_free);
  p_socket_set_timeout(lVar4,1000);
  vtable.f_free = (_func_void_ppointer *)p_socket_address_new("127.0.0.1",0x7dd7);
  if (vtable.f_free == (_func_void_ppointer *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x25d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_connect(lVar4,vtable.f_free,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x25e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(vtable.f_free);
  vtable.f_realloc = pmem_free;
  local_30 = pmem_alloc;
  vtable.f_malloc = pmem_realloc;
  iVar1 = p_mem_set_vtable(&local_30);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x268);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_new(2,2,0x11);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x26d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  uVar2 = p_socket_get_fd(lVar4);
  lVar5 = p_socket_new_from_fd(uVar2,0);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x26e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_get_local_address(lVar4,0);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x26f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_get_remote_address(lVar4,0);
  if (lVar5 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x270);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_mem_restore_vtable();
  p_socket_close(lVar4,0);
  p_socket_free(lVar4);
  p_libsys_shutdown();
  pVar3 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar3 = 0;
  }
  return pVar3;
}

Assistant:

P_TEST_CASE_BEGIN (psocket_nomem_test)
{
	p_libsys_init ();

	PSocket *socket = p_socket_new (P_SOCKET_FAMILY_INET,
					P_SOCKET_TYPE_DATAGRAM,
					P_SOCKET_PROTOCOL_UDP,
					NULL);
	P_TEST_CHECK (socket != NULL);

	PSocketAddress *sock_addr = p_socket_address_new ("127.0.0.1", 32211);

	P_TEST_CHECK (sock_addr != NULL);
	P_TEST_CHECK (p_socket_bind (socket, sock_addr, TRUE, NULL) == TRUE);

	p_socket_address_free (sock_addr);

	p_socket_set_timeout (socket, 1000);
	sock_addr = p_socket_address_new ("127.0.0.1", 32215);
	P_TEST_CHECK (sock_addr != NULL);
	P_TEST_CHECK (p_socket_connect (socket, sock_addr, NULL) == TRUE);

	p_socket_address_free (sock_addr);

	PMemVTable vtable;

	vtable.f_free    = pmem_free;
	vtable.f_malloc  = pmem_alloc;
	vtable.f_realloc = pmem_realloc;

	P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

	P_TEST_CHECK (p_socket_new (P_SOCKET_FAMILY_INET,
				   P_SOCKET_TYPE_DATAGRAM,
				   P_SOCKET_PROTOCOL_UDP,
				   NULL) == NULL);
	P_TEST_CHECK (p_socket_new_from_fd (p_socket_get_fd (socket), NULL) == NULL);
	P_TEST_CHECK (p_socket_get_local_address (socket, NULL) == NULL);
	P_TEST_CHECK (p_socket_get_remote_address (socket, NULL) == NULL);

	p_mem_restore_vtable ();

	p_socket_close (socket, NULL);
	p_socket_free (socket);

	p_libsys_shutdown ();
}